

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

int __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::truncate
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this,char *__file,
          __off_t __length)

{
  int in_EAX;
  int extraout_EAX;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *this_00;
  
  for (this_00 = this->_stack + (long)__file; this_00 != this->_cursor; this_00 = this_00 + 1) {
    Kernel::RationalConstantType::~RationalConstantType((RationalConstantType *)this_00);
    in_EAX = extraout_EAX;
  }
  this->_cursor = this->_stack + (long)__file;
  return in_EAX;
}

Assistant:

inline
  void truncate(size_t len)
  {
    ASS_LE(len,length());
    C* p=_stack+len;
    while(p!=_cursor) {
      (p++)->~C();
    }
    _cursor = _stack+len;
  }